

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParenthesizedExpressionSyntax *node;
  SignedCastExpressionSyntax *pSVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  ParenthesizedExpressionSyntax *args_2;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  args_2 = (ParenthesizedExpressionSyntax *)TVar2.info;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  node = TVar2._0_8_;
  not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ParenthesizedExpressionSyntax_*> *)0x7a556f);
  deepClone<slang::syntax::ParenthesizedExpressionSyntax>(node,(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SignedCastExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ParenthesizedExpressionSyntax&>
                     (unaff_retaddr,(Token *)__fn,args_1,args_2);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SignedCastExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SignedCastExpressionSyntax>(
        node.signing.deepClone(alloc),
        node.apostrophe.deepClone(alloc),
        *deepClone<ParenthesizedExpressionSyntax>(*node.inner, alloc)
    );
}